

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O1

void __thiscall QCalendarWidgetPrivate::updateCurrentPage(QCalendarWidgetPrivate *this,QDate date)

{
  undefined8 uVar1;
  int year;
  int month;
  long lVar2;
  QItemSelectionModel *pQVar3;
  long in_FS_OFFSET;
  int col;
  int row;
  QDate maxDate;
  QDate minDate;
  undefined1 local_68 [24];
  int local_50;
  int local_4c;
  long local_48;
  long local_40;
  QDate local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(undefined8 *)&this->m_model->m_calendar;
  lVar2 = *(long *)(*(long *)(*(long *)&(this->super_QWidgetPrivate).field_0x8 + 8) + 600);
  local_40 = *(long *)(lVar2 + 0x28);
  local_48 = *(long *)(lVar2 + 0x30);
  local_38.jd = date.jd;
  if (local_40 + 0xb69eeff91fU < 0x16d3e147974) {
    lVar2 = QDate::daysTo((QDate)&local_40);
    if (lVar2 < 0) {
      local_38.jd = local_40;
    }
  }
  if (local_48 + 0xb69eeff91fU < 0x16d3e147974) {
    lVar2 = QDate::daysTo((QDate)&local_48);
    if (0 < lVar2) {
      local_38.jd = local_48;
    }
  }
  year = QDate::year(&local_38,uVar1);
  month = QDate::month(&local_38,uVar1);
  showMonth(this,year,month);
  local_4c = -1;
  local_50 = -1;
  QtPrivate::QCalendarModel::cellForDate(this->m_model,local_38,&local_4c,&local_50);
  if ((local_4c != -1) && (local_50 != -1)) {
    pQVar3 = QAbstractItemView::selectionModel((QAbstractItemView *)this->m_view);
    (**(code **)(*(long *)this->m_model + 0x60))(local_68,this->m_model,local_4c,local_50);
    (**(code **)(*(long *)pQVar3 + 0x60))(pQVar3,local_68,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarWidgetPrivate::updateCurrentPage(QDate date)
{
    Q_Q(QCalendarWidget);
    QCalendar cal = m_model->calendar();

    QDate newDate = date;
    QDate minDate = q->minimumDate();
    QDate maxDate = q->maximumDate();
    if (minDate.isValid()&& minDate.daysTo(newDate) < 0)
        newDate = minDate;
    if (maxDate.isValid()&& maxDate.daysTo(newDate) > 0)
        newDate = maxDate;
    showMonth(newDate.year(cal), newDate.month(cal));
    int row = -1, col = -1;
    m_model->cellForDate(newDate, &row, &col);
    if (row != -1 && col != -1)
    {
        m_view->selectionModel()->setCurrentIndex(m_model->index(row, col),
                                                  QItemSelectionModel::NoUpdate);
    }
}